

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O3

size_t BuildAndStoreLiteralPrefixCode
                 (MemoryManager *m,uint8_t *input,size_t input_size,uint8_t *depths,uint16_t *bits,
                 size_t *storage_ix,uint8_t *storage)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar10;
  undefined1 auVar9 [16];
  uint32_t histogram [256];
  
  memset(histogram,0,0x400);
  if (input_size < 0x8000) {
    if (input_size != 0) {
      sVar1 = 0;
      do {
        histogram[input[sVar1]] = histogram[input[sVar1]] + 1;
        sVar1 = sVar1 + 1;
      } while (input_size != sVar1);
    }
    lVar5 = 0;
    lVar2 = 0;
    do {
      uVar8 = histogram[lVar2];
      uVar10 = histogram[lVar2 + 1];
      uVar6 = -(uint)(-0x7ffffff6 < (int)(uVar8 ^ 0x80000000));
      uVar7 = -(uint)(-0x7ffffff6 < (int)(uVar10 ^ 0x80000000));
      uVar6 = (uVar6 & 0xb | ~uVar6 & uVar8) * 2;
      uVar7 = (uVar7 & 0xb | ~uVar7 & uVar10) * 2;
      *(ulong *)(histogram + lVar2) = CONCAT44(uVar10 + uVar7,uVar8 + uVar6);
      input_size = input_size + uVar6;
      lVar5 = lVar5 + (ulong)uVar7;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 0x100);
  }
  else {
    uVar3 = 0;
    do {
      histogram[input[uVar3]] = histogram[input[uVar3]] + 1;
      uVar3 = uVar3 + 0x1d;
    } while (uVar3 < input_size);
    input_size = (input_size + 0x1c) / 0x1d;
    lVar5 = 0;
    lVar2 = 0;
    do {
      uVar6 = histogram[lVar2];
      uVar7 = histogram[lVar2 + 1];
      uVar8 = -(uint)(-0x7ffffff6 < (int)(uVar6 ^ 0x80000000));
      uVar10 = -(uint)(-0x7ffffff6 < (int)(uVar7 ^ 0x80000000));
      auVar9._4_4_ = (uVar10 & 0xb | ~uVar10 & uVar7) * 2;
      auVar9._0_4_ = (uVar8 & 0xb | ~uVar8 & uVar6) * 2;
      auVar9._8_8_ = 0;
      auVar9 = auVar9 | _DAT_0017f0d0;
      *(ulong *)(histogram + lVar2) = CONCAT44(uVar7 + auVar9._4_4_,uVar6 + auVar9._0_4_);
      input_size = input_size + (auVar9._0_8_ & 0xffffffff);
      lVar5 = lVar5 + (ulong)auVar9._4_4_;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 0x100);
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,histogram,lVar5 + input_size,8,depths,bits,storage_ix,storage);
  lVar2 = 0;
  lVar4 = 0;
  do {
    if (histogram[lVar4] != 0) {
      lVar2 = lVar2 + (ulong)(histogram[lVar4] * (uint)depths[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  return (ulong)(lVar2 * 0x7d) / (lVar5 + input_size);
}

Assistant:

static size_t BuildAndStoreLiteralPrefixCode(MemoryManager* m,
                                             const uint8_t* input,
                                             const size_t input_size,
                                             uint8_t depths[256],
                                             uint16_t bits[256],
                                             size_t* storage_ix,
                                             uint8_t* storage) {
  uint32_t histogram[256] = { 0 };
  size_t histogram_total;
  size_t i;
  if (input_size < (1 << 15)) {
    for (i = 0; i < input_size; ++i) {
      ++histogram[input[i]];
    }
    histogram_total = input_size;
    for (i = 0; i < 256; ++i) {
      /* We weigh the first 11 samples with weight 3 to account for the
         balancing effect of the LZ77 phase on the histogram. */
      const uint32_t adjust = 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  } else {
    static const size_t kSampleRate = 29;
    for (i = 0; i < input_size; i += kSampleRate) {
      ++histogram[input[i]];
    }
    histogram_total = (input_size + kSampleRate - 1) / kSampleRate;
    for (i = 0; i < 256; ++i) {
      /* We add 1 to each population count to avoid 0 bit depths (since this is
         only a sample and we don't know if the symbol appears or not), and we
         weigh the first 11 samples with weight 3 to account for the balancing
         effect of the LZ77 phase on the histogram (more frequent symbols are
         more likely to be in backward references instead as literals). */
      const uint32_t adjust = 1 + 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, histogram, histogram_total,
                                     /* max_bits = */ 8,
                                     depths, bits, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return 0;
  {
    size_t literal_ratio = 0;
    for (i = 0; i < 256; ++i) {
      if (histogram[i]) literal_ratio += histogram[i] * depths[i];
    }
    /* Estimated encoding ratio, millibytes per symbol. */
    return (literal_ratio * 125) / histogram_total;
  }
}